

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOWFileParser.cpp
# Opt level: O2

void __thiscall BOWFileParser::writeWordList(BOWFileParser *this,string *wordListFilename)

{
  pointer pbVar1;
  int v;
  ulong uVar2;
  long lVar3;
  ofstream wordListFp;
  
  std::ofstream::ofstream((string *)&wordListFp);
  std::ofstream::open((string *)&wordListFp,(_Ios_Openmode)wordListFilename);
  lVar3 = 0;
  for (uVar2 = 0;
      pbVar1 = (this->_wordList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->_wordList).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar2 = uVar2 + 1) {
    std::operator<<((ostream *)&wordListFp,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3));
    if (uVar2 != ((long)(this->_wordList).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_wordList).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
      std::endl<char,std::char_traits<char>>((ostream *)&wordListFp);
    }
    lVar3 = lVar3 + 0x20;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&wordListFp);
  return;
}

Assistant:

void BOWFileParser::writeWordList(string wordListFilename)const{//{{{
    ofstream wordListFp;
    wordListFp.open(wordListFilename,ios::out);
    for(int v=0;v<_wordList.size();v++){
        wordListFp<<_wordList[v];
        if(v!=(_wordList.size()-1))wordListFp<<endl;
    }
    wordListFp.close();
}